

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::EmitOpcode(Parser *this,Opcode opcode)

{
  pointer pDVar1;
  bool bVar2;
  uint32_t uVar3;
  DebugLineEntry in_RAX;
  DebugLineEntry local_18;
  
  local_18 = in_RAX;
  bVar2 = EnableDebugInfo();
  if (bVar2) {
    pDVar1 = (this->m_debugLines).
             super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar1) {
      uVar3 = this->m_lastLine;
    }
    else {
      uVar3 = this->m_lastLine;
      if (pDVar1[-1].lineNumber == uVar3) goto LAB_0011b9b6;
    }
    local_18.lineNumber = uVar3;
    local_18.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_18);
  }
LAB_0011b9b6:
  BinaryWriter::Write(&this->m_writer,(uint8_t)opcode);
  return;
}

Assistant:

inline_t void Parser::EmitOpcode(Opcode opcode)
	{
		// Only bother with writing this information if we're generating debug info
		if (EnableDebugInfo())
		{
			// Only write a new entry when we're at a new line, since that's all we're tracking
			if (m_debugLines.empty() || m_debugLines.back().lineNumber != m_lastLine)
			{
				auto pos = static_cast<uint32_t>(m_writer.Tell());
				m_debugLines.push_back({ pos, m_lastLine });
			}
		}
		m_writer.Write<Opcode, uint8_t>(opcode);
	}